

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_init_size(mp_int *a,int size)

{
  mp_digit *pmVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = (size - size % 0x20) + 0x40;
  pmVar1 = (mp_digit *)malloc((long)(int)uVar4 << 3);
  a->dp = pmVar1;
  if (pmVar1 == (mp_digit *)0x0) {
    iVar2 = -2;
  }
  else {
    a->used = 0;
    a->alloc = uVar4;
    a->sign = 0;
    iVar2 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = 0;
    }
    for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      pmVar1[uVar3] = 0;
    }
  }
  return iVar2;
}

Assistant:

int mp_init_size (mp_int * a, int size)
{
  int x;

  /* pad size so there are always extra digits */
  size += (MP_PREC * 2) - (size % MP_PREC);	
  
  /* alloc mem */
  a->dp = OPT_CAST(mp_digit) XMALLOC (sizeof (mp_digit) * size);
  if (a->dp == NULL) {
    return MP_MEM;
  }

  /* set the members */
  a->used  = 0;
  a->alloc = size;
  a->sign  = MP_ZPOS;

  /* zero the digits */
  for (x = 0; x < size; x++) {
      a->dp[x] = 0;
  }

  return MP_OKAY;
}